

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosided_exponential_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::twosided_exponential_dist<float>::icdf
          (twosided_exponential_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  
  if (0.0 <= x) {
    if (x <= 1.0) {
      if ((x == 1.0) && (!NAN(x))) {
        return INFINITY;
      }
      if ((x == 0.0) && (!NAN(x))) {
        return -INFINITY;
      }
      fVar3 = (this->P).mu_;
      if (0.5 <= x) {
        fVar3 = -fVar3;
        fVar2 = 2.0 - (x + x);
      }
      else {
        fVar2 = x + x;
      }
      fVar2 = logf(fVar2);
      return fVar3 * fVar2;
    }
  }
  piVar1 = __errno_location();
  *piVar1 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return -math::numeric_limits<result_type>::infinity();
      return x < math::constants<result_type>::one_half ? P.mu() * math::ln(2 * x)
                                                        : -P.mu() * math::ln(2 - 2 * x);
    }